

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O1

int __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::clone
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  puVar3 = (undefined8 *)operator_new(0x18);
  iVar1 = (*((this->expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  *puVar3 = &PTR__rt_unary_expr_001116c8;
  puVar3[1] = CONCAT44(extraout_var,iVar1);
  puVar3[2] = CONCAT44(extraout_var_00,iVar2);
  return (int)puVar3;
}

Assistant:

InterfaceType * clone() const { return new rt_unary_expr(expr_->clone(), op_->clone()); }